

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QRegularExpression
QRegularExpression::fromWildcard
          (QStringView pattern,CaseSensitivity cs,WildcardConversionOptions options)

{
  PatternOptions options_00;
  undefined4 in_register_00000014;
  WildcardConversionOptions in_R8D;
  long in_FS_OFFSET;
  QStringView pattern_00;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  pattern_00.m_size._4_4_ = in_register_00000014;
  pattern_00.m_size._0_4_ = cs;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pattern_00.m_data._0_4_ =
       in_R8D.super_QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4>.
       super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i;
  pattern_00.m_data._4_4_ = 0;
  wildcardToRegularExpression
            ((QString *)&QStack_38,(QRegularExpression *)pattern.m_data,pattern_00,in_R8D);
  options_00.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
  super_QFlagsStorage<QRegularExpression::PatternOption>.i._1_3_ = 0;
  options_00.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
  super_QFlagsStorage<QRegularExpression::PatternOption>.i._0_1_ =
       (QFlagsStorage<QRegularExpression::WildcardConversionOption>)
       options.super_QFlagsStorageHelper<QRegularExpression::WildcardConversionOption,_4>.
       super_QFlagsStorage<QRegularExpression::WildcardConversionOption>.i !=
       (QFlagsStorage<QRegularExpression::WildcardConversionOption>)0x1;
  QRegularExpression((QRegularExpression *)pattern.m_size,(QString *)&QStack_38,options_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)pattern.m_size;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpression QRegularExpression::fromWildcard(QStringView pattern, Qt::CaseSensitivity cs,
                                                    WildcardConversionOptions options)
{
    auto reOptions = cs == Qt::CaseSensitive ? QRegularExpression::NoPatternOption :
                                             QRegularExpression::CaseInsensitiveOption;
    return QRegularExpression(wildcardToRegularExpression(pattern, options), reOptions);
}